

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3AppendToNode(Blob *pNode,Blob *pPrev,char *zTerm,int nTerm,char *aDoclist,int nDoclist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int nSuffix;
  int nPrefix;
  int bFirst;
  int rc;
  int nDoclist_local;
  char *aDoclist_local;
  char *pcStack_28;
  int nTerm_local;
  char *zTerm_local;
  Blob *pPrev_local;
  Blob *pNode_local;
  
  nPrefix = 0;
  iVar3 = pPrev->n;
  bFirst = nDoclist;
  _rc = aDoclist;
  aDoclist_local._4_4_ = nTerm;
  pcStack_28 = zTerm;
  zTerm_local = (char *)pPrev;
  pPrev_local = pNode;
  blobGrowBuffer(pPrev,nTerm,&nPrefix);
  if (nPrefix == 0) {
    iVar1 = fts3PrefixCompress(*(char **)zTerm_local,*(int *)(zTerm_local + 8),pcStack_28,
                               aDoclist_local._4_4_);
    iVar2 = aDoclist_local._4_4_ - iVar1;
    memcpy(*(void **)zTerm_local,pcStack_28,(long)aDoclist_local._4_4_);
    *(int *)(zTerm_local + 8) = aDoclist_local._4_4_;
    if (iVar3 != 0) {
      iVar3 = sqlite3Fts3PutVarint(pPrev_local->a + pPrev_local->n,(long)iVar1);
      pPrev_local->n = iVar3 + pPrev_local->n;
    }
    iVar3 = sqlite3Fts3PutVarint(pPrev_local->a + pPrev_local->n,(long)iVar2);
    pPrev_local->n = iVar3 + pPrev_local->n;
    memcpy(pPrev_local->a + pPrev_local->n,pcStack_28 + iVar1,(long)iVar2);
    pPrev_local->n = iVar2 + pPrev_local->n;
    if (_rc != (char *)0x0) {
      iVar3 = sqlite3Fts3PutVarint(pPrev_local->a + pPrev_local->n,(long)bFirst);
      pPrev_local->n = iVar3 + pPrev_local->n;
      memcpy(pPrev_local->a + pPrev_local->n,_rc,(long)bFirst);
      pPrev_local->n = bFirst + pPrev_local->n;
    }
    pNode_local._4_4_ = 0;
  }
  else {
    pNode_local._4_4_ = nPrefix;
  }
  return pNode_local._4_4_;
}

Assistant:

static int fts3AppendToNode(
  Blob *pNode,                    /* Current node image to append to */
  Blob *pPrev,                    /* Buffer containing previous term written */
  const char *zTerm,              /* New term to write */
  int nTerm,                      /* Size of zTerm in bytes */
  const char *aDoclist,           /* Doclist (or NULL) to write */
  int nDoclist                    /* Size of aDoclist in bytes */ 
){
  int rc = SQLITE_OK;             /* Return code */
  int bFirst = (pPrev->n==0);     /* True if this is the first term written */
  int nPrefix;                    /* Size of term prefix in bytes */
  int nSuffix;                    /* Size of term suffix in bytes */

  /* Node must have already been started. There must be a doclist for a
  ** leaf node, and there must not be a doclist for an internal node.  */
  assert( pNode->n>0 );
  assert( (pNode->a[0]=='\0')==(aDoclist!=0) );

  blobGrowBuffer(pPrev, nTerm, &rc);
  if( rc!=SQLITE_OK ) return rc;

  nPrefix = fts3PrefixCompress(pPrev->a, pPrev->n, zTerm, nTerm);
  nSuffix = nTerm - nPrefix;
  memcpy(pPrev->a, zTerm, nTerm);
  pPrev->n = nTerm;

  if( bFirst==0 ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nPrefix);
  }
  pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nSuffix);
  memcpy(&pNode->a[pNode->n], &zTerm[nPrefix], nSuffix);
  pNode->n += nSuffix;

  if( aDoclist ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nDoclist);
    memcpy(&pNode->a[pNode->n], aDoclist, nDoclist);
    pNode->n += nDoclist;
  }

  assert( pNode->n<=pNode->nAlloc );

  return SQLITE_OK;
}